

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TArray<FRemapTablePtr,_FRemapTable_*>::Resize
          (TArray<FRemapTablePtr,_FRemapTable_*> *this,uint amount)

{
  uint uVar1;
  
  uVar1 = this->Count;
  if (amount < uVar1 || amount - uVar1 == 0) {
    if (amount != 0 && uVar1 == 0) {
      __assert_fail("last != ~0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./tarray.h"
                    ,0x1ad,
                    "void TArray<FRemapTablePtr, FRemapTable *>::DoDelete(unsigned int, unsigned int) [T = FRemapTablePtr, TT = FRemapTable *]"
                   );
    }
  }
  else {
    Grow(this,amount - uVar1);
    uVar1 = this->Count;
    if (uVar1 < amount) {
      memset(this->Array + uVar1,0,(ulong)(~uVar1 + amount) * 8 + 8);
    }
  }
  this->Count = amount;
  return;
}

Assistant:

void Resize (unsigned int amount)
	{
		if (Count < amount)
		{
			// Adding new entries
			Grow (amount - Count);
			for (unsigned int i = Count; i < amount; ++i)
			{
				::new((void *)&Array[i]) T;
			}
		}
		else if (Count != amount)
		{
			// Deleting old entries
			DoDelete (amount, Count - 1);
		}
		Count = amount;
	}